

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autoutils.c
# Opt level: O3

int runstattests(double *x,int N,char *test,char *mtype,double alpha)

{
  char cVar1;
  double dVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  double dStack_f8;
  double cval [9];
  double dStack_a8;
  double auxstat [2];
  double teststat [3];
  double dStack_78;
  double cprobs [3];
  int local_58;
  int local_54;
  int cvcols;
  int ltstat;
  double stat;
  int laux;
  int local_3c;
  double dStack_38;
  int klag;
  
  cval[7] = 0.0;
  cval[5] = 0.0;
  cval[6] = 0.0;
  cval[3] = 0.0;
  cval[4] = 0.0;
  cval[1] = 0.0;
  cval[2] = 0.0;
  dStack_f8 = 0.0;
  cval[0] = 0.0;
  cprobs[1] = 0.0;
  dStack_78 = 0.0;
  cprobs[0] = 0.0;
  dStack_a8 = 0.0;
  auxstat[0] = 0.0;
  auxstat[1] = 0.0;
  dStack_38 = alpha;
  iVar3 = strcmp(test,"kpss");
  if (iVar3 == 0) {
    pcVar4 = "level";
    iVar3 = strcmp(mtype,"level");
    if (iVar3 != 0) {
      pcVar4 = "trend";
      iVar3 = strcmp(mtype,"trend");
      if (iVar3 != 0) {
LAB_001337c9:
        pcVar4 = "ndiffs only accepts one of two types : level and trend. ";
LAB_0013391e:
        puts(pcVar4);
        exit(-1);
      }
    }
    dVar2 = (double)N;
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    local_3c = (int)((dVar2 * 3.0) / 13.0);
    ur_kpss(x,N,pcVar4,1,&local_3c,(double *)&cvcols,&stat);
    bVar6 = dStack_38 == stat;
    bVar5 = dStack_38 < stat;
  }
  else {
    cVar1 = *test;
    if (cVar1 == 'd') {
      if (((test[1] != 'f') || (test[2] != '\0')) && (iVar3 = strcmp(test,"adf"), iVar3 != 0)) {
LAB_00133917:
        pcVar4 = "Only three tests are allowed - kpss, df and pp ";
        goto LAB_0013391e;
      }
LAB_0013379d:
      iVar3 = strcmp(mtype,"level");
      if (iVar3 == 0) {
        pcVar4 = "drift";
      }
      else {
        pcVar4 = "trend";
        iVar3 = strcmp(mtype,"trend");
        if (iVar3 != 0) goto LAB_001337c9;
      }
      local_3c = 1;
      ur_df2(x,N,pcVar4,&local_3c,"fixed",&dStack_f8,(int *)&stat,&local_58,&dStack_78,auxstat + 1,
             &local_54);
      uVar7 = SUB84(auxstat[1],0);
      uVar8 = (undefined4)((ulong)auxstat[1] >> 0x20);
      _cvcols = auxstat[1];
    }
    else {
      iVar3 = strcmp(test,"adf");
      if (iVar3 == 0) goto LAB_0013379d;
      if (((cVar1 != 'p') || (test[1] != 'p')) || (test[2] != '\0')) goto LAB_00133917;
      iVar3 = strcmp(mtype,"level");
      if (iVar3 == 0) {
        pcVar4 = "constant";
      }
      else {
        pcVar4 = "trend";
        iVar3 = strcmp(mtype,"trend");
        if (iVar3 != 0) {
          pcVar4 = "ndiffs KPSS only accepts one of two types : level and trend. ";
          goto LAB_0013391e;
        }
      }
      ur_pp2(x,N,"Z-tau",pcVar4,1,(int *)0x0,&dStack_f8,&dStack_78,&dStack_a8,(int *)&stat,
             (double *)&cvcols);
      uVar7 = SUB84(_cvcols,0);
      uVar8 = (undefined4)((ulong)_cvcols >> 0x20);
    }
    dVar2 = interpolate_linear(&dStack_f8,&dStack_78,3,(double)CONCAT44(uVar8,uVar7));
    bVar6 = dVar2 == dStack_38;
    bVar5 = dVar2 < dStack_38;
  }
  return (int)(!bVar5 && !bVar6);
}

Assistant:

static int runstattests(double *x, int N, const char * test,const char *mtype,double alpha) {
    int diff,klag,lshort;
    const char *alternative;
    const char *type;
    const char *model;
    const char *selectlags;
    double stat, pval;
    double cval[9] = {0,0,0,0,0,0,0,0,0};
	double cprobs[3] = {0,0,0};
	double auxstat[2] = {0,0};
    double teststat[3] = {0,0,0};
	int laux,pN,cvrows,cvcols,ltstat;

    if (!strcmp(test,"kpss")) {
        if (!strcmp(mtype,"level")) {
            type = "level";
        } else if (!strcmp(mtype,"trend")) {
            type = "trend";
        } else {
            printf("ndiffs only accepts one of two types : level and trend. \n");
            exit(-1);
        }
        
        klag = (int) 3.0 * sqrt((double)N) / 13.0;
        lshort = 1;
        ur_kpss(x,N,type,lshort,&klag,&stat,&pval);
        //printf("KPSS stat %g pval %g \n",stat,pval);
        diff = (pval < alpha) ? 1 : 0;
    } else if (!strcmp(test,"df") || !strcmp(test,"adf")) {
        if (!strcmp(mtype,"level")) {
            type = "drift";
        } else if (!strcmp(mtype,"trend")) {
            type = "trend";
        } else {
            printf("ndiffs only accepts one of two types : level and trend. \n");
            exit(-1);
        }
        selectlags = "fixed";
        klag = 1;
        pN = 3;
        //alternative = "stationary";
        //ur_df(x,N,alternative,NULL,&stat,&pval);
        ur_df2(x,N,type,&klag,selectlags,cval,&cvrows,&cvcols, cprobs, teststat,&ltstat);
        stat = teststat[0];
        pval = interpolate_linear(cval,cprobs,pN,stat);
        //printf("ADF stat %g pval %g \n",stat,pval);
        diff = (pval > alpha) ? 1 : 0;
    } else if (!strcmp(test,"pp")) {
        if (!strcmp(mtype,"level")) {
            model = "constant";
        } else if (!strcmp(mtype,"trend")) {
            model = "trend";
        } else {
            printf("ndiffs KPSS only accepts one of two types : level and trend. \n");
            exit(-1);
        }
        type = "Z-tau";
        lshort = 1;
        pN = 3;
        //ur_pp(x,N,alternative,type,lshort,NULL, &stat,&pval);
        ur_pp2(x,N,type,model,lshort,NULL,cval,cprobs,auxstat,&laux,&stat);
        pval = interpolate_linear(cval,cprobs,pN,stat);
        //printf("PP stat %g pval %g \n",stat,pval);
        diff = (pval > alpha) ? 1 : 0;
    } else {
        printf("Only three tests are allowed - kpss, df and pp \n");
        exit(-1);
    }

    return diff;
}